

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

int __thiscall testing::internal::String::Compare(String *this,String *rhs)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  pcVar2 = rhs->c_str_;
  if (this->c_str_ == (char *)0x0) {
    iVar6 = -(uint)(pcVar2 != (char *)0x0);
  }
  else {
    iVar6 = 1;
    if (pcVar2 != (char *)0x0) {
      uVar3 = this->length_;
      uVar4 = rhs->length_;
      uVar7 = uVar4;
      if (uVar3 < uVar4) {
        uVar7 = uVar3;
      }
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          cVar1 = this->c_str_[uVar8];
          if (cVar1 < pcVar2[uVar8]) {
            return -1;
          }
          if (pcVar2[uVar8] < cVar1) {
            return 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      uVar5 = 0xffffffff;
      if (uVar4 <= uVar3) {
        uVar5 = (uint)(uVar4 < uVar3);
      }
      return uVar5;
    }
  }
  return iVar6;
}

Assistant:

const char* c_str() const { return c_str_; }